

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void __thiscall QListView::updateGeometries(QListView *this)

{
  QAbstractItemModel *pQVar1;
  bool bVar2;
  int iVar3;
  ScrollBarPolicy SVar4;
  QListViewPrivate *this_00;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QListViewPrivate *d;
  QSize step;
  QModelIndex index;
  QStyleOptionViewItem option;
  int in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  QListViewPrivate *in_stack_fffffffffffffe50;
  QAbstractSlider *in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 uVar5;
  QSize local_140;
  QPersistentModelIndex local_138 [3];
  undefined1 *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  QPersistentModelIndex local_108 [3];
  QPersistentModelIndex local_f0 [3];
  undefined1 local_d8 [208];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QListView *)0x87ee00);
  QWidget::geometry(in_RDI);
  bVar2 = QRect::isEmpty((QRect *)in_stack_fffffffffffffe50);
  uVar5 = true;
  if (!bVar2) {
    pQVar1 = (this_00->super_QAbstractItemViewPrivate).model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_f0);
    iVar3 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,local_f0);
    uVar5 = true;
    if (0 < iVar3) {
      pQVar1 = (this_00->super_QAbstractItemViewPrivate).model;
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_108);
      iVar3 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,local_108);
      uVar5 = iVar3 < 1;
    }
  }
  if ((bool)uVar5 == false) {
    local_120 = &DAT_aaaaaaaaaaaaaaaa;
    local_118 = &DAT_aaaaaaaaaaaaaaaa;
    local_110 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar1 = (this_00->super_QAbstractItemViewPrivate).model;
    iVar3 = this_00->column;
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_138);
    (**(code **)(*(long *)pQVar1 + 0x60))(&local_120,pQVar1,0,iVar3,local_138);
    memset(local_d8,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem((QStyleOptionViewItem *)0x87efa2);
    (**(code **)(*(long *)in_RDI + 0x2f8))(in_RDI,local_d8);
    local_140 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    local_140 = QListViewPrivate::itemSize
                          (this_00,(QStyleOptionViewItem *)CONCAT17(uVar5,in_stack_fffffffffffffe98)
                           ,(QModelIndex *)in_RDI);
    (*this_00->commonListView->_vptr_QCommonListViewBase[0xf])(this_00->commonListView,&local_140);
    (*this_00->commonListView->_vptr_QCommonListViewBase[0x10])(this_00->commonListView,&local_140);
    QStyleOptionViewItem::~QStyleOptionViewItem((QStyleOptionViewItem *)in_stack_fffffffffffffe50);
  }
  else {
    QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)in_stack_fffffffffffffe50);
    QAbstractSlider::setRange
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68);
    QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)in_stack_fffffffffffffe50);
    QAbstractSlider::setRange
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68);
  }
  QAbstractItemView::updateGeometries((QAbstractItemView *)in_stack_fffffffffffffe50);
  if ((this_00->movement == Static) && (bVar2 = QListViewPrivate::isWrapping(this_00), !bVar2)) {
    QAbstractScrollAreaPrivate::layoutChildren
              ((QAbstractScrollAreaPrivate *)in_stack_fffffffffffffe50);
    if (this_00->flow == TopToBottom) {
      SVar4 = QAbstractScrollArea::horizontalScrollBarPolicy
                        ((QAbstractScrollArea *)in_stack_fffffffffffffe50);
      if (SVar4 == ScrollBarAlwaysOff) {
        QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_fffffffffffffe50);
        iVar3 = QWidget::width((QWidget *)0x87f092);
        contentsSize((QListView *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        QSize::height((QSize *)0x87f0af);
        QListViewPrivate::setContentsSize
                  (in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48);
        QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)in_stack_fffffffffffffe50);
        QAbstractSlider::setRange((QAbstractSlider *)this_00,iVar3,in_stack_fffffffffffffe68);
      }
    }
    else {
      SVar4 = QAbstractScrollArea::verticalScrollBarPolicy
                        ((QAbstractScrollArea *)in_stack_fffffffffffffe50);
      if (SVar4 == ScrollBarAlwaysOff) {
        contentsSize((QListView *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        QSize::width((QSize *)0x87f109);
        QAbstractScrollArea::viewport((QAbstractScrollArea *)this_00);
        QWidget::height((QWidget *)0x87f11f);
        QListViewPrivate::setContentsSize
                  (this_00,in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48);
        QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this_00);
        QAbstractSlider::setRange
                  (in_stack_fffffffffffffe60,in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QListView::updateGeometries()
{
    Q_D(QListView);
    if (geometry().isEmpty() || d->model->rowCount(d->root) <= 0 || d->model->columnCount(d->root) <= 0) {
        horizontalScrollBar()->setRange(0, 0);
        verticalScrollBar()->setRange(0, 0);
    } else {
        QModelIndex index = d->model->index(0, d->column, d->root);
        QStyleOptionViewItem option;
        initViewItemOption(&option);
        QSize step = d->itemSize(option, index);
        d->commonListView->updateHorizontalScrollBar(step);
        d->commonListView->updateVerticalScrollBar(step);
    }

    QAbstractItemView::updateGeometries();

    // if the scroll bars are turned off, we resize the contents to the viewport
    if (d->movement == Static && !d->isWrapping()) {
        d->layoutChildren(); // we need the viewport size to be updated
        if (d->flow == TopToBottom) {
            if (horizontalScrollBarPolicy() == Qt::ScrollBarAlwaysOff) {
                d->setContentsSize(viewport()->width(), contentsSize().height());
                horizontalScrollBar()->setRange(0, 0); // we see all the contents anyway
            }
        } else { // LeftToRight
            if (verticalScrollBarPolicy() == Qt::ScrollBarAlwaysOff) {
                d->setContentsSize(contentsSize().width(), viewport()->height());
                verticalScrollBar()->setRange(0, 0); // we see all the contents anyway
            }
        }
    }

}